

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef BinaryenGlobalGet(BinaryenModuleRef module,char *name,BinaryenType type)

{
  IString *this;
  BinaryenExpressionRef pEVar1;
  undefined1 in_CL;
  string_view sVar2;
  
  this = (IString *)strlen(name);
  sVar2._M_str = (char *)0x0;
  sVar2._M_len = (size_t)name;
  sVar2 = wasm::IString::interned(this,sVar2,(bool)in_CL);
  pEVar1 = (BinaryenExpressionRef)MixedArena::allocSpace(&module->allocator,0x20,8);
  pEVar1->_id = GlobalGetId;
  (pEVar1->type).id = 0;
  *(undefined8 *)(pEVar1 + 1) = 0;
  *(string_view *)(pEVar1 + 1) = sVar2;
  (pEVar1->type).id = type;
  return pEVar1;
}

Assistant:

BinaryenExpressionRef BinaryenGlobalGet(BinaryenModuleRef module,
                                        const char* name,
                                        BinaryenType type) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeGlobalGet(name, Type(type)));
}